

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_TrailerFieldNodeMissingNameAttribute::
TestreadFromDocument_TrailerFieldNodeMissingNameAttribute
          (TestreadFromDocument_TrailerFieldNodeMissingNameAttribute *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"readFromDocument_TrailerFieldNodeMissingNameAttribute",
             "DataDictionaryTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DataDictionaryTestCase.cpp"
             ,0x59c);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031c310;
  return;
}

Assistant:

TEST(readFromDocument_TrailerFieldNodeMissingNameAttribute) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml =
      "<fix type='FIX' major='4' minor='2' servicepack='0'>"
        "<header>"
          "<field name='BeginString' required='Y' />"
        "</header>"
        "<fields>"
          "<field number='8' name='BeginString' type='STRING' >"
            "<value enum='1' description='SINGLE_SECURITY' />"
          "</field>"
        "</fields>"
        "<trailer>"
          "<field required='Y' />" // name attribute missing
        "</trailer>"
      "</fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}